

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int pr_cust(customer_t *c,int mode)

{
  FILE *pFVar1;
  int in_ECX;
  int in_R8D;
  
  if (pr_cust::fp == (FILE *)0x0) {
    pr_cust::fp = print_prep(3,0);
  }
  pFVar1 = pr_cust::fp;
  fprintf((FILE *)pr_cust::fp,"%ld",c->custkey);
  fputc(0x7c,(FILE *)pFVar1);
  pFVar1 = pr_cust::fp;
  fputs(c->name,(FILE *)pr_cust::fp);
  fputc(0x7c,(FILE *)pFVar1);
  pFVar1 = pr_cust::fp;
  fputs(c->address,(FILE *)pr_cust::fp);
  fputc(0x7c,(FILE *)pFVar1);
  pFVar1 = pr_cust::fp;
  fprintf((FILE *)pr_cust::fp,"%ld",c->nation_code);
  fputc(0x7c,(FILE *)pFVar1);
  pFVar1 = pr_cust::fp;
  fputs(c->phone,(FILE *)pr_cust::fp);
  fputc(0x7c,(FILE *)pFVar1);
  dbg_print(5,pr_cust::fp,&c->acctbal,in_ECX,in_R8D);
  pFVar1 = pr_cust::fp;
  fputs(c->mktsegment,(FILE *)pr_cust::fp);
  fputc(0x7c,(FILE *)pFVar1);
  pFVar1 = pr_cust::fp;
  fputs(c->comment,(FILE *)pr_cust::fp);
  fputc(0x7c,(FILE *)pFVar1);
  fputc(10,(FILE *)pr_cust::fp);
  return 0;
}

Assistant:

int
pr_cust(customer_t *c, int mode)
{
   static FILE *fp = NULL;
   UNUSED(mode);
        
   if (fp == NULL)
        fp = print_prep(CUST, 0);

   PR_STRT(fp);
   PR_HUGE(fp, &c->custkey);
   if (scale <= 3000)
   PR_VSTR(fp, c->name, C_NAME_LEN);
   else
   PR_VSTR(fp, c->name, C_NAME_LEN + 3);
   PR_VSTR(fp, c->address, c->alen);
   PR_HUGE(fp, &c->nation_code);
   PR_STR(fp, c->phone, PHONE_LEN);
   PR_MONEY(fp, &c->acctbal);
   PR_STR(fp, c->mktsegment, C_MSEG_LEN);
   PR_VSTR_LAST(fp, c->comment, c->clen);
   PR_END(fp);

   return(0);
}